

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O0

void __thiscall BmsParser::Parser::ParseHeaderValue(Parser *this,char *str)

{
  bool bVar1;
  int time;
  BmsRegistArraySet *pBVar2;
  pointer ppVar3;
  char *str_00;
  char *__nptr;
  BmsSTPManager *this_00;
  BmsHeaderTable *this_01;
  double measure;
  int time_;
  double measure_;
  char *time_s_;
  char *measure_s_;
  string local_50 [36];
  BmsWord local_2c;
  Iterator IStack_28;
  BmsWord pos;
  _Self local_20;
  Iterator it;
  char *str_local;
  Parser *this_local;
  
  it._M_node = (_Base_ptr)str;
  std::__cxx11::string::assign((char *)&this->value_);
  bVar1 = std::operator==(&this->key_,"EXBPM");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->key_,"BPM");
  }
  pBVar2 = BmsBms::GetRegistArraySet(this->bms_);
  local_20._M_node = (_Base_ptr)BmsRegistArraySet::Begin_abi_cxx11_(pBVar2);
  while( true ) {
    pBVar2 = BmsBms::GetRegistArraySet(this->bms_);
    IStack_28 = BmsRegistArraySet::End_abi_cxx11_(pBVar2);
    bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar1) {
      bVar1 = std::operator==(&this->key_,"STP");
      if (bVar1) {
        str_00 = anon_unknown_2::ParseSeparator((char *)it._M_node);
        __nptr = anon_unknown_2::ParseSeparator(str_00);
        if ((str_00 == (char *)0x0) || (__nptr == (char *)0x0)) {
          WriteLogLine(this,"%d line - Failed to parse #STP (%s)",(ulong)(uint)this->line_,
                       it._M_node);
        }
        else {
          measure = atof(str_00);
          time = atoi(__nptr);
          this_00 = BmsBms::GetSTPManager(this->bms_);
          BmsSTPManager::Add(this_00,measure,time);
        }
      }
      else {
        this_01 = BmsBms::GetHeaders(this->bms_);
        BmsHeaderTable::Set(this_01,&this->key_,&this->value_);
      }
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
             ::operator->(&local_20);
    bVar1 = BmsRegistArray::CheckConstruction(&ppVar3->first,&this->key_);
    if (bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
    ::operator++(&local_20);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_50,(ulong)&this->key_);
  BmsWord::BmsWord(&local_2c,local_50);
  std::__cxx11::string::~string((string *)local_50);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsRegistArray_*>_>
           ::operator->(&local_20);
  BmsRegistArray::Set(ppVar3->second,&local_2c,&this->value_);
  BmsWord::~BmsWord(&local_2c);
  return;
}

Assistant:

void Parser::ParseHeaderValue(const char* str)
	{
		// regist value or metadata(header) value
		value_.assign(str);
		// #EXBPM behaves same as #BPM
		if (key_ == "EXBPM") key_ = "BPM";
		for (auto it = bms_.GetRegistArraySet().Begin(); it != bms_.GetRegistArraySet().End(); ++it) {
			if (BmsRegistArray::CheckConstruction(it->first, key_)) {
				BmsWord pos(key_.substr(key_.length() - 2));
				it->second->Set(pos, value_);
				return;
			}
		}
		// if proper regist array hadn't found
		// then add to header
		if (key_ == "STP") {
			const char* measure_s_ = ParseSeparator(str);
			const char* time_s_ = ParseSeparator(measure_s_);
			if (!measure_s_ || !time_s_) {
				WriteLogLine("%d line - Failed to parse #STP (%s)", line_, str);
				return;
			}
			double  measure_ = atof(measure_s_);
			int time_ = atoi(time_s_);
			bms_.GetSTPManager().Add(measure_, time_);
		}
		else {
			bms_.GetHeaders().Set(key_, value_);
		}
	}